

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

void Wln_NtkStaticFanoutTest(Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  printf("Printing fanouts of %d objects of network \"%s\":\n",(ulong)(uint)(p->vTypes).nSize,
         p->pName);
  Wln_NtkStaticFanoutStart(p);
  if (1 < (p->vTypes).nSize) {
    lVar5 = 1;
    do {
      Wln_ObjPrint(p,(int)lVar5);
      printf("   Fanouts : ");
      if ((p->vRefs).nSize <= lVar5) {
LAB_003614db:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar4 = 0;
      while (lVar4 < (p->vRefs).pArray[lVar5]) {
        iVar1 = (p->vFanout).nSize;
        if (iVar1 <= lVar5) goto LAB_003614db;
        piVar3 = (p->vFanout).pArray;
        iVar2 = piVar3[lVar5];
        if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        printf("%5d ",(ulong)(uint)piVar3[iVar2 + lVar4]);
        lVar4 = lVar4 + 1;
        if ((p->vRefs).nSize <= lVar5) goto LAB_003614db;
      }
      putchar(10);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vTypes).nSize);
  }
  Wln_NtkStaticFanoutStop(p);
  putchar(10);
  return;
}

Assistant:

void Wln_NtkStaticFanoutTest( Wln_Ntk_t * p )
{
    int k, iObj, iFanout;
    printf( "Printing fanouts of %d objects of network \"%s\":\n", Wln_NtkObjNum(p), p->pName );
    Wln_NtkStaticFanoutStart( p );
    Wln_NtkForEachObj( p, iObj )
    {
        Wln_ObjPrint( p, iObj );
        printf( "   Fanouts : " );
        Wln_ObjForEachFanoutStatic( p, iObj, iFanout, k )
            printf( "%5d ", iFanout );
        printf( "\n" );
    }
    Wln_NtkStaticFanoutStop( p );
    printf( "\n" );
}